

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O1

void * __thiscall xercesc_4_0::DOMLSParserImpl::getParameter(DOMLSParserImpl *this,XMLCh *name)

{
  bool bVar1;
  int iVar2;
  ValSchemes VVar3;
  XMLSize_t *pXVar4;
  XMLCh *pXVar5;
  SecurityManager *pSVar6;
  DOMException *this_00;
  
  iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMCharsetOverridesXMLEncoding);
  if (iVar2 == 0) {
    return (void *)(ulong)this->fCharsetOverridesXMLEncoding;
  }
  iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMDisallowDoctype);
  if (iVar2 == 0) {
    return (void *)(ulong)((this->super_AbstractDOMParser).fScanner)->fDisallowDTD;
  }
  iVar2 = XMLString::compareIStringASCII
                    (name,(XMLCh *)XMLUni::fgDOMIgnoreUnknownCharacterDenormalization);
  if (iVar2 != 0) {
    iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMNamespaces);
    if (iVar2 == 0) {
      bVar1 = AbstractDOMParser::getDoNamespaces(&this->super_AbstractDOMParser);
LAB_002e3553:
      return (void *)(ulong)bVar1;
    }
    iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMResourceResolver);
    if (iVar2 == 0) {
      return this->fEntityResolver;
    }
    iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMSupportedMediatypesOnly);
    if (iVar2 != 0) {
      iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMValidate);
      if (iVar2 == 0) {
        VVar3 = AbstractDOMParser::getValidationScheme(&this->super_AbstractDOMParser);
        return (void *)(ulong)(VVar3 != Val_Never);
      }
      iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMValidateIfSchema);
      if (iVar2 == 0) {
        VVar3 = AbstractDOMParser::getValidationScheme(&this->super_AbstractDOMParser);
        return (void *)(ulong)(VVar3 == Val_Auto);
      }
      iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMWellFormed);
      if (iVar2 == 0) {
        return (void *)0x1;
      }
      iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMCanonicalForm);
      if (((iVar2 != 0) &&
          (iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMCDATASections),
          iVar2 != 0)) &&
         (iVar2 = XMLString::compareIStringASCII
                            (name,(XMLCh *)XMLUni::fgDOMCheckCharacterNormalization), iVar2 != 0)) {
        iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMComments);
        if (iVar2 == 0) {
          return (void *)(ulong)(this->super_AbstractDOMParser).fCreateCommentNodes;
        }
        iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMDatatypeNormalization);
        if (iVar2 == 0) {
          return (void *)(ulong)((this->super_AbstractDOMParser).fScanner)->fNormalizeData;
        }
        iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMElementContentWhitespace);
        if (iVar2 == 0) {
          return (void *)(ulong)(this->super_AbstractDOMParser).fIncludeIgnorableWhitespace;
        }
        iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMEntities);
        if (iVar2 == 0) {
          return (void *)(ulong)(this->super_AbstractDOMParser).fCreateEntityReferenceNodes;
        }
        iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMErrorHandler);
        if (iVar2 == 0) {
          return this->fErrorHandler;
        }
        iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMNamespaceDeclarations);
        if (iVar2 == 0) {
          return (void *)0x1;
        }
        iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMNormalizeCharacters);
        if (((iVar2 != 0) &&
            (iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMSchemaLocation),
            iVar2 != 0)) &&
           ((iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMSchemaType),
            iVar2 != 0 &&
            (iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMSplitCDATASections),
            iVar2 != 0)))) {
          iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMInfoset);
          if (iVar2 == 0) {
            return (void *)0x1;
          }
          iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesSchema);
          if (iVar2 == 0) {
            bVar1 = AbstractDOMParser::getDoSchema(&this->super_AbstractDOMParser);
          }
          else {
            iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesSchemaFullChecking)
            ;
            if (iVar2 == 0) {
              bVar1 = AbstractDOMParser::getValidationSchemaFullChecking
                                (&this->super_AbstractDOMParser);
            }
            else {
              iVar2 = XMLString::compareIStringASCII
                                (name,(XMLCh *)XMLUni::fgXercesIdentityConstraintChecking);
              if (iVar2 == 0) {
                bVar1 = AbstractDOMParser::getIdentityConstraintChecking
                                  (&this->super_AbstractDOMParser);
              }
              else {
                iVar2 = XMLString::compareIStringASCII
                                  (name,(XMLCh *)XMLUni::fgXercesLoadExternalDTD);
                if (iVar2 == 0) {
                  bVar1 = AbstractDOMParser::getLoadExternalDTD(&this->super_AbstractDOMParser);
                }
                else {
                  iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesLoadSchema);
                  if (iVar2 == 0) {
                    bVar1 = AbstractDOMParser::getLoadSchema(&this->super_AbstractDOMParser);
                  }
                  else {
                    iVar2 = XMLString::compareIStringASCII
                                      (name,(XMLCh *)XMLUni::fgXercesContinueAfterFatalError);
                    if (iVar2 == 0) {
                      bVar1 = AbstractDOMParser::getExitOnFirstFatalError
                                        (&this->super_AbstractDOMParser);
                      bVar1 = !bVar1;
                    }
                    else {
                      iVar2 = XMLString::compareIStringASCII
                                        (name,(XMLCh *)XMLUni::fgXercesValidationErrorAsFatal);
                      if (iVar2 != 0) {
                        iVar2 = XMLString::compareIStringASCII
                                          (name,(XMLCh *)XMLUni::fgXercesCacheGrammarFromParse);
                        if (iVar2 == 0) {
                          return (void *)(ulong)((this->super_AbstractDOMParser).fScanner)->
                                                fToCacheGrammar;
                        }
                        iVar2 = XMLString::compareIStringASCII
                                          (name,(XMLCh *)XMLUni::fgXercesUseCachedGrammarInParse);
                        if (iVar2 == 0) {
                          return (void *)(ulong)((this->super_AbstractDOMParser).fScanner)->
                                                fUseCachedGrammar;
                        }
                        iVar2 = XMLString::compareIStringASCII
                                          (name,(XMLCh *)XMLUni::fgXercesCalculateSrcOfs);
                        if (iVar2 == 0) {
                          return (void *)(ulong)((this->super_AbstractDOMParser).fScanner)->
                                                fCalculateSrcOfs;
                        }
                        iVar2 = XMLString::compareIStringASCII
                                          (name,(XMLCh *)XMLUni::fgXercesStandardUriConformant);
                        if (iVar2 == 0) {
                          return (void *)(ulong)((this->super_AbstractDOMParser).fScanner)->
                                                fStandardUriConformant;
                        }
                        iVar2 = XMLString::compareIStringASCII
                                          (name,(XMLCh *)XMLUni::fgXercesUserAdoptsDOMDocument);
                        if (iVar2 == 0) {
                          return (void *)(ulong)this->fUserAdoptsDocument;
                        }
                        iVar2 = XMLString::compareIStringASCII
                                          (name,(XMLCh *)XMLUni::fgXercesDOMHasPSVIInfo);
                        if (iVar2 == 0) {
                          return (void *)(ulong)(this->super_AbstractDOMParser).fCreateSchemaInfo;
                        }
                        iVar2 = XMLString::compareIStringASCII
                                          (name,(XMLCh *)XMLUni::
                                                  fgXercesGenerateSyntheticAnnotations);
                        if (iVar2 == 0) {
                          return (void *)(ulong)((this->super_AbstractDOMParser).fScanner)->
                                                fGenerateSyntheticAnnotations;
                        }
                        iVar2 = XMLString::compareIStringASCII
                                          (name,(XMLCh *)XMLUni::fgXercesValidateAnnotations);
                        if (iVar2 == 0) {
                          return (void *)(ulong)((this->super_AbstractDOMParser).fScanner)->
                                                fValidateAnnotations;
                        }
                        iVar2 = XMLString::compareIStringASCII
                                          (name,(XMLCh *)XMLUni::fgXercesIgnoreCachedDTD);
                        if (iVar2 == 0) {
                          return (void *)(ulong)((this->super_AbstractDOMParser).fScanner)->
                                                fIgnoreCachedDTD;
                        }
                        iVar2 = XMLString::compareIStringASCII
                                          (name,(XMLCh *)XMLUni::fgXercesIgnoreAnnotations);
                        if (iVar2 == 0) {
                          return (void *)(ulong)((this->super_AbstractDOMParser).fScanner)->
                                                fIgnoreAnnotations;
                        }
                        iVar2 = XMLString::compareIStringASCII
                                          (name,(XMLCh *)XMLUni::
                                                  fgXercesDisableDefaultEntityResolution);
                        if (iVar2 == 0) {
                          return (void *)(ulong)((this->super_AbstractDOMParser).fScanner)->
                                                fDisableDefaultEntityResolution;
                        }
                        iVar2 = XMLString::compareIStringASCII
                                          (name,(XMLCh *)XMLUni::fgXercesSkipDTDValidation);
                        if (iVar2 == 0) {
                          return (void *)(ulong)((this->super_AbstractDOMParser).fScanner)->
                                                fSkipDTDValidation;
                        }
                        iVar2 = XMLString::compareIStringASCII
                                          (name,(XMLCh *)XMLUni::fgXercesHandleMultipleImports);
                        if (iVar2 == 0) {
                          return (void *)(ulong)((this->super_AbstractDOMParser).fScanner)->
                                                fHandleMultipleImports;
                        }
                        iVar2 = XMLString::compareIStringASCII
                                          (name,(XMLCh *)XMLUni::fgXercesEntityResolver);
                        if (iVar2 == 0) {
                          return this->fXMLEntityResolver;
                        }
                        iVar2 = XMLString::compareIStringASCII
                                          (name,(XMLCh *)XMLUni::
                                                  fgXercesSchemaExternalSchemaLocation);
                        if (iVar2 == 0) {
                          pXVar5 = AbstractDOMParser::getExternalSchemaLocation
                                             (&this->super_AbstractDOMParser);
                          return pXVar5;
                        }
                        iVar2 = XMLString::compareIStringASCII
                                          (name,(XMLCh *)XMLUni::
                                                  fgXercesSchemaExternalNoNameSpaceSchemaLocation);
                        if (iVar2 != 0) {
                          iVar2 = XMLString::compareIStringASCII
                                            (name,(XMLCh *)XMLUni::fgXercesSecurityManager);
                          if (iVar2 == 0) {
                            pSVar6 = AbstractDOMParser::getSecurityManager
                                               (&this->super_AbstractDOMParser);
                            return pSVar6;
                          }
                          iVar2 = XMLString::compareIStringASCII
                                            (name,(XMLCh *)XMLUni::fgXercesDoXInclude);
                          if (iVar2 == 0) {
                            return (void *)(ulong)(this->super_AbstractDOMParser).fDoXInclude;
                          }
                          iVar2 = XMLString::compareIStringASCII
                                            (name,(XMLCh *)XMLUni::fgXercesLowWaterMark);
                          if (iVar2 != 0) {
                            this_00 = (DOMException *)__cxa_allocate_exception(0x28);
                            DOMException::DOMException
                                      (this_00,8,0,(this->super_AbstractDOMParser).fMemoryManager);
                            __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException)
                            ;
                          }
                          pXVar4 = AbstractDOMParser::getLowWaterMark
                                             (&this->super_AbstractDOMParser);
                          return pXVar4;
                        }
                        pXVar5 = AbstractDOMParser::getExternalNoNamespaceSchemaLocation
                                           (&this->super_AbstractDOMParser);
                        return pXVar5;
                      }
                      bVar1 = AbstractDOMParser::getValidationConstraintFatal
                                        (&this->super_AbstractDOMParser);
                    }
                  }
                }
              }
            }
          }
          goto LAB_002e3553;
        }
      }
    }
  }
  return (void *)0x0;
}

Assistant:

const void* DOMLSParserImpl::getParameter(const XMLCh* name) const
{
    if (XMLString::compareIStringASCII(name, XMLUni::fgDOMCharsetOverridesXMLEncoding) == 0)
    {
        return (void*)fCharsetOverridesXMLEncoding;
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMDisallowDoctype) == 0)
    {
        return (void*)getScanner()->getDisallowDTD();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMIgnoreUnknownCharacterDenormalization) == 0)
    {
        // TODO
        return 0;
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMNamespaces) == 0)
    {
        return (void*)getDoNamespaces();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMResourceResolver) == 0)
    {
        return fEntityResolver;
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMSupportedMediatypesOnly) == 0)
    {
        return (void*)false;
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMValidate) == 0)
    {
        return (void*)(getValidationScheme() != AbstractDOMParser::Val_Never);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMValidateIfSchema) == 0)
    {
        return (void*)(getValidationScheme() == AbstractDOMParser::Val_Auto);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMWellFormed) == 0)
    {
        return (void*)true;
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMCanonicalForm) == 0 )
    {
        // TODO
        return 0;
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMCDATASections) == 0 )
    {
        // TODO
        return 0;
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMCheckCharacterNormalization) == 0 )
    {
        // TODO
        return 0;
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMComments) == 0)
    {
        return (void*)getCreateCommentNodes();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMDatatypeNormalization) == 0)
    {
        return (void*)getScanner()->getNormalizeData();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMElementContentWhitespace) == 0)
    {
        return (void*)getIncludeIgnorableWhitespace();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMEntities) == 0)
    {
        return (void*)getCreateEntityReferenceNodes();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMErrorHandler) == 0)
    {
        return fErrorHandler;
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMNamespaceDeclarations) == 0)
    {
        return (void*)true;
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMNormalizeCharacters) == 0)
    {
        return 0;
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMSchemaLocation) == 0)
    {
        return 0;
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMSchemaType) == 0)
    {
        return 0;
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMSplitCDATASections) == 0)
    {
        return 0;
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMInfoset) == 0)
    {
        return (void*)true;
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesSchema) == 0)
    {
        return (void*)getDoSchema();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesSchemaFullChecking) == 0)
    {
        return (void*)getValidationSchemaFullChecking();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesIdentityConstraintChecking) == 0)
    {
        return (void*)getIdentityConstraintChecking();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesLoadExternalDTD) == 0)
    {
        return (void*)getLoadExternalDTD();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesLoadSchema) == 0)
    {
        return (void*)getLoadSchema();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesContinueAfterFatalError) == 0)
    {
        return (void*)!getExitOnFirstFatalError();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesValidationErrorAsFatal) == 0)
    {
        return (void*)getValidationConstraintFatal();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesCacheGrammarFromParse) == 0)
    {
        return (void*)getScanner()->isCachingGrammarFromParse();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesUseCachedGrammarInParse) == 0)
    {
        return (void*)getScanner()->isUsingCachedGrammarInParse();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesCalculateSrcOfs) == 0)
    {
        return (void*)getScanner()->getCalculateSrcOfs();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesStandardUriConformant) == 0)
    {
        return (void*)getScanner()->getStandardUriConformant();
    }
    else if(XMLString::compareIStringASCII(name, XMLUni::fgXercesUserAdoptsDOMDocument) == 0)
    {
        return (void*)fUserAdoptsDocument;
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesDOMHasPSVIInfo) == 0)
    {
        return (void*)getCreateSchemaInfo();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesGenerateSyntheticAnnotations) == 0)
    {
        return (void*)getScanner()->getGenerateSyntheticAnnotations();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesValidateAnnotations) == 0)
    {
        return (void*)getScanner()->getValidateAnnotations();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesIgnoreCachedDTD) == 0)
    {
        return (void*)getScanner()->getIgnoreCachedDTD();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesIgnoreAnnotations) == 0)
    {
        return (void*)getScanner()->getIgnoreAnnotations();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesDisableDefaultEntityResolution) == 0)
    {
        return (void*)getScanner()->getDisableDefaultEntityResolution();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesSkipDTDValidation) == 0)
    {
        return (void*)getScanner()->getSkipDTDValidation();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesHandleMultipleImports) == 0)
    {
        return (void*)getScanner()->getHandleMultipleImports();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesEntityResolver) == 0)
    {
        return fXMLEntityResolver;
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesSchemaExternalSchemaLocation) == 0)
    {
        return getExternalSchemaLocation();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesSchemaExternalNoNameSpaceSchemaLocation) == 0)
    {
        return getExternalNoNamespaceSchemaLocation();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesSecurityManager) == 0)
    {
        return getSecurityManager();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesDoXInclude) == 0)
    {
        return (void *)getDoXInclude();
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesLowWaterMark) == 0)
    {
      return (void*)&getLowWaterMark();
    }
    else
        throw DOMException(DOMException::NOT_FOUND_ERR, 0, getMemoryManager());
}